

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  char *zFormat;
  stat buf;
  
  if ((pFile->ctrlFlags & 0x80) == 0) {
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,&buf);
    if (iVar1 == 0) {
      if (buf.st_nlink == 0) {
        zFormat = "file unlinked while open: %s";
      }
      else if (buf.st_nlink == 1) {
        iVar1 = fileHasMoved(pFile);
        if (iVar1 == 0) {
          return;
        }
        zFormat = "file renamed while open: %s";
      }
      else {
        zFormat = "multiple links to file: %s";
      }
    }
    else {
      zFormat = "cannot fstat db file %s";
    }
    sqlite3_log(0x1c,zFormat,pFile->zPath);
  }
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;

  /* These verifications occurs for the main database only */
  if( pFile->ctrlFlags & UNIXFILE_NOLOCK ) return;

  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    return;
  }
  if( fileHasMoved(pFile) ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    return;
  }
}